

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

bool __thiscall
rtosc::UndoHistoryImpl::mergeEvent(UndoHistoryImpl *this,time_t now,char *msg,char *buf,size_t N)

{
  int iVar1;
  reference pvVar2;
  char *pcVar3;
  char *__s2;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *in_RCX;
  char *in_RDX;
  time_t in_RSI;
  long in_RDI;
  double dVar4;
  rtosc_arg_t rVar5;
  rtosc_arg_t rVar6;
  rtosc_arg_t args [3];
  int i;
  size_type in_stack_ffffffffffffff18;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
  *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  uint idx;
  char *in_stack_ffffffffffffff30;
  int local_34;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x50) == 0) {
    local_1 = false;
  }
  else {
    local_34 = (int)*(undefined8 *)(in_RDI + 0x50);
    do {
      local_34 = local_34 + -1;
      if (local_34 < 0) {
        return false;
      }
      pvVar2 = std::
               deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      dVar4 = difftime(in_RSI,pvVar2->first);
      if (2.0 < dVar4) {
        return false;
      }
      pcVar3 = getUndoAddress((char *)in_stack_ffffffffffffff20);
      std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
      operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __s2 = getUndoAddress((char *)in_stack_ffffffffffffff20);
      iVar1 = strcmp(pcVar3,__s2);
      idx = (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    } while (iVar1 != 0);
    rVar5 = rtosc_argument(in_stack_ffffffffffffff30,idx);
    pcVar3 = rVar5.s;
    std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
    operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    rVar6 = rtosc_argument(in_stack_ffffffffffffff30,idx);
    rtosc_argument(in_stack_ffffffffffffff30,idx);
    rtosc_argument_string(in_RDX);
    rtosc_amessage(pcVar3,(size_t)rVar5.b.data,rVar5.s,(char *)rVar6.b.data,(rtosc_arg_t *)rVar6.s);
    pvVar2 = std::
             deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
             operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (pvVar2->second != (char *)0x0) {
      operator_delete__(pvVar2->second);
    }
    pvVar2 = std::
             deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
             operator[](in_RCX,in_stack_ffffffffffffff18);
    pvVar2->second = (char *)in_RCX;
    pvVar2 = std::
             deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
             operator[](in_RCX,in_stack_ffffffffffffff18);
    pvVar2->first = in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool UndoHistoryImpl::mergeEvent(time_t now, const char *msg, char *buf, size_t N)
{
    if(history_pos == 0)
        return false;
    for(int i=history_pos-1; i>=0; --i) {
        if(difftime(now, history[i].first) > 2)
            break;
        if(!strcmp(getUndoAddress(msg),
                    getUndoAddress(history[i].second)))
        {
            //We can splice events together, merging them into one event
            rtosc_arg_t args[3];
            args[0] = rtosc_argument(msg, 0);
            args[1] = rtosc_argument(history[i].second,1);
            args[2] = rtosc_argument(msg, 2);

            rtosc_amessage(buf, N, msg, rtosc_argument_string(msg), args);

            delete [] history[i].second;
            history[i].second = buf;
            history[i].first = now;
            return true;
        }
    }
    return false;
}